

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

void __thiscall capnp::_::ReaderArena::~ReaderArena(ReaderArena *this)

{
  kj::
  MutexGuarded<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_>
  ::~MutexGuarded(&this->moreSegments);
  operator_delete(this,0xa8);
  return;
}

Assistant:

ReaderArena::~ReaderArena() noexcept(false) {}